

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

x86XmmReg __thiscall CodeGenGenericContext::GetXmmReg(CodeGenGenericContext *this)

{
  x86XmmReg lastXmmReg;
  x86XmmReg res;
  CodeGenGenericContext *this_local;
  
  this_local._4_4_ = this->currFreeXmmReg;
  if (this->currFreeXmmReg == rXMM15) {
    this->currFreeXmmReg = rXMM0;
  }
  else {
    this->currFreeXmmReg = this->currFreeXmmReg + rXMM1;
  }
  if ((this_local._4_4_ == this->lockedXmmRegA) || (this_local._4_4_ == this->lockedXmmRegB)) {
    this_local._4_4_ = GetXmmReg(this);
  }
  return this_local._4_4_;
}

Assistant:

x86XmmReg CodeGenGenericContext::GetXmmReg()
{
	// Simple rotation
	x86XmmReg res = currFreeXmmReg;

#if defined(_MSC_VER) && defined(_M_X64)
	x86XmmReg lastXmmReg = rXMM5; // Less volatile registers than on x86
#elif defined(_MSC_VER)
	x86XmmReg lastXmmReg = rXMM7;
#elif defined(_M_X64)
	x86XmmReg lastXmmReg = rXMM15;
#else
	x86XmmReg lastXmmReg = rXMM7;
#endif

	if(currFreeXmmReg == lastXmmReg)
		currFreeXmmReg = rXMM0;
	else
		currFreeXmmReg = x86XmmReg(currFreeXmmReg + 1);

	if(res == lockedXmmRegA || res == lockedXmmRegB)
		return GetXmmReg();

	return res;
}